

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze_live_input_pass.cpp
# Opt level: O2

Status __thiscall
spvtools::opt::AnalyzeLiveInputPass::DoLiveInputAnalysis(AnalyzeLiveInputPass *this)

{
  ExecutionModel EVar1;
  Status SVar2;
  LivenessManager *this_00;
  
  EVar1 = IRContext::GetStage((this->super_Pass).context_);
  SVar2 = Failure;
  if (0xfffffffb < EVar1 - ExecutionModelGLCompute) {
    this_00 = IRContext::get_liveness_mgr((this->super_Pass).context_);
    analysis::LivenessManager::GetLiveness(this_00,this->live_locs_,this->live_builtins_);
    SVar2 = SuccessWithoutChange;
  }
  return SVar2;
}

Assistant:

Pass::Status AnalyzeLiveInputPass::DoLiveInputAnalysis() {
  // Current functionality only supports frag, tesc, tese or geom shaders.
  // Report failure for any other stage.
  auto stage = context()->GetStage();
  if (stage != spv::ExecutionModel::Fragment &&
      stage != spv::ExecutionModel::TessellationControl &&
      stage != spv::ExecutionModel::TessellationEvaluation &&
      stage != spv::ExecutionModel::Geometry)
    return Status::Failure;
  context()->get_liveness_mgr()->GetLiveness(live_locs_, live_builtins_);
  return Status::SuccessWithoutChange;
}